

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filesystem.c++
# Opt level: O2

String * kj::Path::stripNul(String *__return_storage_ptr__,String *input)

{
  size_t sVar1;
  size_t count;
  char *pcVar2;
  char *pcVar3;
  char c;
  Vector<char> output;
  char local_69;
  ArrayBuilder<char> local_68;
  Array<char> local_48;
  
  sVar1 = (input->content).size_;
  count = 0;
  if (sVar1 != 0) {
    count = sVar1 - 1;
  }
  local_68.ptr = kj::_::HeapArrayDisposer::allocateUninitialized<char>(count);
  local_68.endPtr = local_68.ptr + count;
  local_68.disposer = (ArrayDisposer *)&kj::_::HeapArrayDisposer::instance;
  pcVar2 = (input->content).ptr;
  sVar1 = (input->content).size_;
  pcVar3 = pcVar2 + (sVar1 - 1);
  if (sVar1 == 0) {
    pcVar3 = (char *)0x0;
    pcVar2 = (char *)0x0;
  }
  local_68.pos = local_68.ptr;
  for (; pcVar2 != pcVar3; pcVar2 = pcVar2 + 1) {
    local_69 = *pcVar2;
    if (local_69 != '\0') {
      Vector<char>::add<char&>((Vector<char> *)&local_68,&local_69);
    }
  }
  local_69 = '\0';
  Vector<char>::add<char>((Vector<char> *)&local_68,&local_69);
  Vector<char>::releaseAsArray(&local_48,(Vector<char> *)&local_68);
  (__return_storage_ptr__->content).ptr = local_48.ptr;
  (__return_storage_ptr__->content).size_ = local_48.size_;
  (__return_storage_ptr__->content).disposer = local_48.disposer;
  local_48.ptr = (char *)0x0;
  local_48.size_ = 0;
  Array<char>::~Array(&local_48);
  ArrayBuilder<char>::dispose(&local_68);
  return __return_storage_ptr__;
}

Assistant:

String Path::stripNul(String input) {
  kj::Vector<char> output(input.size());
  for (char c: input) {
    if (c != '\0') output.add(c);
  }
  output.add('\0');
  return String(output.releaseAsArray());
}